

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Arena * __thiscall google::protobuf::Reflection::GetArena(Reflection *this,Message *message)

{
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  Container *pCVar1;
  Reflection *in_RSI;
  Message *in_stack_ffffffffffffffc8;
  Arena *local_18;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)GetInternalMetadataWithArena(in_RSI,in_stack_ffffffffffffffc8);
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    pCVar1 = internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             ::
             PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                       (this_00);
    local_18 = pCVar1->arena;
  }
  else {
    local_18 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::PtrValue<google::protobuf::Arena>
                         ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           *)this_00);
  }
  return local_18;
}

Assistant:

Arena* Reflection::GetArena(Message* message) const {
  return GetInternalMetadataWithArena(*message).arena();
}